

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriCommon.c
# Opt level: O1

UriBool uriRemoveDotSegmentsExW
                  (UriUriW *uri,UriBool relative,UriBool pathOwned,UriMemoryManager *memory)

{
  UriPathSegmentW **ppUVar1;
  wchar_t *pwVar2;
  UriPathSegmentW *pUVar3;
  void *pvVar4;
  long *plVar5;
  int *piVar6;
  bool bVar7;
  bool bVar8;
  UriPathSegmentW *pUVar9;
  int iVar10;
  UriPathSegmentW **ppUVar11;
  wchar_t *pwVar12;
  UriPathSegmentW *pUVar13;
  UriPathSegmentW *pUVar14;
  wchar_t *pwVar15;
  UriPathSegmentW *segment;
  bool bVar16;
  
  if ((uri != (UriUriW *)0x0) && (pUVar13 = uri->pathHead, pUVar13 != (UriPathSegmentW *)0x0)) {
    ppUVar1 = &uri->pathHead;
    pUVar13->reserved = (void *)0x0;
    do {
      pwVar15 = (pUVar13->text).first;
      pwVar2 = (pUVar13->text).afterLast;
      bVar7 = false;
      iVar10 = (int)((ulong)((long)pwVar2 - (long)pwVar15) >> 2);
      if (iVar10 == 2) {
        if ((*pwVar15 != L'.') || (pwVar15[1] != L'.')) goto LAB_001b875e;
        bVar16 = false;
        plVar5 = (long *)pUVar13->reserved;
        bVar7 = true;
        if (relative != 0) {
          if (plVar5 == (long *)0x0) {
            bVar16 = true;
            bVar7 = false;
          }
          else {
            piVar6 = (int *)*plVar5;
            if ((plVar5[1] - (long)piVar6 == 8) && (*piVar6 == 0x2e)) {
              bVar16 = piVar6[1] == 0x2e;
              bVar7 = !bVar16;
            }
            else {
              bVar16 = false;
            }
          }
        }
        bVar8 = true;
        if (!bVar16) {
          pUVar3 = pUVar13->next;
          if (plVar5 == (long *)0x0) {
            if (pUVar3 == (UriPathSegmentW *)0x0) {
              if (uri->absolutePath == 0) {
                if ((pathOwned != 0) && (pwVar15 != pwVar2)) {
                  (*memory->free)(memory,pwVar15);
                }
                bVar8 = true;
                (pUVar13->text).first = anon_var_dwarf_faa62;
                (pUVar13->text).afterLast = anon_var_dwarf_faa62;
                pUVar13 = pUVar3;
                goto LAB_001b8aaa;
              }
              *ppUVar1 = (UriPathSegmentW *)0x0;
              uri->pathTail = (UriPathSegmentW *)0x0;
            }
            else {
              *ppUVar1 = pUVar3;
              pUVar3->reserved = (void *)0x0;
            }
            if ((pathOwned != 0) && (pwVar15 != pwVar2)) {
              (*memory->free)(memory,pwVar15);
            }
            (*memory->free)(memory,pUVar13);
          }
          else {
            pvVar4 = (void *)plVar5[3];
            if (pvVar4 == (void *)0x0) {
              if (pUVar3 != (UriPathSegmentW *)0x0) {
                *ppUVar1 = pUVar3;
                pUVar3->reserved = (void *)0x0;
                if ((pathOwned != 0) && (pwVar15 != pwVar2)) goto LAB_001b8a5a;
                goto LAB_001b8a61;
              }
              if ((pathOwned != 0) && (pwVar15 != pwVar2)) {
                (*memory->free)(memory,pwVar15);
              }
              (pUVar13->text).first = anon_var_dwarf_faa62;
              (pUVar13->text).afterLast = anon_var_dwarf_faa62;
              uri->pathHead = pUVar13;
              uri->pathTail = pUVar13;
LAB_001b8a6b:
              if ((pathOwned != 0) &&
                 (pUVar13 = (UriPathSegmentW *)*plVar5, pUVar13 != (UriPathSegmentW *)plVar5[1]))
              goto LAB_001b8a87;
            }
            else {
              *(UriPathSegmentW **)((long)pvVar4 + 0x10) = pUVar3;
              if (pUVar13->next == (UriPathSegmentStructW *)0x0) {
                pUVar9 = (UriPathSegmentW *)(*memory->calloc)(memory,1,0x20);
                if (pUVar9 == (UriPathSegmentW *)0x0) {
                  pUVar14 = pUVar13;
                  if (pathOwned == 0) {
LAB_001b8a22:
                    (*memory->free)(memory,pUVar14);
                  }
                  else {
                    pwVar2 = (pUVar13->text).first;
                    if (pwVar2 != (pUVar13->text).afterLast) {
                      (*memory->free)(memory,pwVar2);
                    }
                    (*memory->free)(memory,pUVar13);
                    if ((pathOwned != 0) &&
                       (pUVar14 = (UriPathSegmentW *)*plVar5,
                       pUVar14 != (UriPathSegmentW *)plVar5[1])) goto LAB_001b8a22;
                  }
                  (*memory->free)(memory,plVar5);
                }
                else {
                  (pUVar9->text).first = anon_var_dwarf_faa62;
                  (pUVar9->text).afterLast = anon_var_dwarf_faa62;
                  *(UriPathSegmentW **)((long)pvVar4 + 0x10) = pUVar9;
                  uri->pathTail = pUVar9;
                }
                if (pUVar9 == (UriPathSegmentW *)0x0) {
                  bVar8 = false;
                  goto LAB_001b8aaa;
                }
              }
              else {
                pUVar13->next->reserved = pvVar4;
              }
              if (pathOwned != 0) {
                pwVar15 = (pUVar13->text).first;
                if (pwVar15 != (pUVar13->text).afterLast) {
LAB_001b8a5a:
                  (*memory->free)(memory,pwVar15);
                }
LAB_001b8a61:
                (*memory->free)(memory,pUVar13);
                goto LAB_001b8a6b;
              }
LAB_001b8a87:
              (*memory->free)(memory,pUVar13);
            }
            (*memory->free)(memory,plVar5);
          }
          bVar8 = true;
          pUVar13 = pUVar3;
        }
LAB_001b8aaa:
        if (bVar8) goto LAB_001b875e;
        bVar16 = false;
      }
      else {
        bVar7 = false;
        if ((iVar10 == 1) && (*pwVar15 == L'.')) {
          pUVar3 = pUVar13->next;
          bVar7 = true;
          if ((relative == 0) || (pUVar3 == (UriPathSegmentW *)0x0 || pUVar13 != *ppUVar1)) {
            bVar16 = false;
          }
          else {
            bVar16 = false;
            for (pwVar12 = (pUVar3->text).first; pwVar12 < (pUVar3->text).afterLast;
                pwVar12 = pwVar12 + 1) {
              bVar16 = *pwVar12 == L':';
              if (bVar16) {
                bVar7 = false;
                break;
              }
            }
          }
          if (!bVar16) {
            pvVar4 = pUVar13->reserved;
            if (pUVar3 == (UriPathSegmentW *)0x0) {
              if ((pathOwned != 0) && (pwVar15 != pwVar2)) {
                (*memory->free)(memory,pwVar15);
              }
              if (pvVar4 == (void *)0x0) {
                if (((((uri->hostText).first == (wchar_t *)0x0) &&
                     ((uri->hostData).ip4 == (UriIp4 *)0x0)) &&
                    ((uri->hostData).ip6 == (UriIp6 *)0x0)) &&
                   ((uri->hostData).ipFuture.first == (wchar_t *)0x0)) {
                  (*memory->free)(memory,pUVar13);
                  *ppUVar1 = (UriPathSegmentW *)0x0;
                  uri->pathTail = (UriPathSegmentW *)0x0;
                  pUVar13 = pUVar3;
                }
                else {
                  (pUVar13->text).first = anon_var_dwarf_faa62;
                  (pUVar13->text).afterLast = anon_var_dwarf_faa62;
                  pUVar13 = pUVar3;
                }
              }
              else {
                (pUVar13->text).first = anon_var_dwarf_faa62;
                (pUVar13->text).afterLast = anon_var_dwarf_faa62;
                pUVar13 = pUVar3;
              }
            }
            else {
              ppUVar11 = (UriPathSegmentW **)((long)pvVar4 + 0x10);
              if (pvVar4 == (void *)0x0) {
                ppUVar11 = ppUVar1;
              }
              pUVar3->reserved = pvVar4;
              *ppUVar11 = pUVar3;
              if ((pathOwned != 0) && (pwVar15 != pwVar2)) {
                (*memory->free)(memory,pwVar15);
              }
              (*memory->free)(memory,pUVar13);
              pUVar13 = pUVar3;
            }
          }
        }
LAB_001b875e:
        bVar16 = true;
        if (!bVar7) {
          pUVar3 = pUVar13->next;
          ppUVar11 = (UriPathSegmentW **)&pUVar3->reserved;
          if (pUVar3 == (UriPathSegmentW *)0x0) {
            ppUVar11 = &uri->pathTail;
          }
          *ppUVar11 = pUVar13;
          pUVar13 = pUVar3;
        }
      }
      if (!bVar16) {
        return 0;
      }
    } while (pUVar13 != (UriPathSegmentW *)0x0);
  }
  return 1;
}

Assistant:

UriBool URI_FUNC(RemoveDotSegmentsEx)(URI_TYPE(Uri) * uri,
		UriBool relative, UriBool pathOwned, UriMemoryManager * memory) {
	URI_TYPE(PathSegment) * walker;
	if ((uri == NULL) || (uri->pathHead == NULL)) {
		return URI_TRUE;
	}

	walker = uri->pathHead;
	walker->reserved = NULL; /* Prev pointer */
	do {
		UriBool removeSegment = URI_FALSE;
		int len = (int)(walker->text.afterLast - walker->text.first);
		switch (len) {
		case 1:
			if ((walker->text.first)[0] == _UT('.')) {
				/* "." segment -> remove if not essential */
				URI_TYPE(PathSegment) * const prev = walker->reserved;
				URI_TYPE(PathSegment) * const nextBackup = walker->next;

				/*
				 * Is this dot segment essential,
				 * i.e. is there a chance of changing semantics by dropping this dot segment?
				 *
				 * For example, changing "./http://foo" into "http://foo" would change semantics
				 * and hence the dot segment is essential to that case and cannot be removed.
				 */
				removeSegment = URI_TRUE;
				if (relative && (walker == uri->pathHead) && (walker->next != NULL)) {
					const URI_CHAR * ch = walker->next->text.first;
					for (; ch < walker->next->text.afterLast; ch++) {
						if (*ch == _UT(':')) {
							removeSegment = URI_FALSE;
							break;
						}
					}
				}

				if (removeSegment) {
					/* .. then let's go remove that segment. */
					/* Last segment? */
					if (walker->next != NULL) {
						/* Not last segment, i.e. first or middle segment
						 * OLD: (prev|NULL) <- walker <- next
						 * NEW: (prev|NULL) <----------- next */
						walker->next->reserved = prev;

						if (prev == NULL) {
							/* First but not last segment
							 * OLD: head -> walker -> next
							 * NEW: head -----------> next */
							uri->pathHead = walker->next;
						} else {
							/* Middle segment
							 * OLD: prev -> walker -> next
							 * NEW: prev -----------> next */
							prev->next = walker->next;
						}

						if (pathOwned && (walker->text.first != walker->text.afterLast)) {
							memory->free(memory, (URI_CHAR *)walker->text.first);
						}
						memory->free(memory, walker);
					} else {
						/* Last segment */
						if (pathOwned && (walker->text.first != walker->text.afterLast)) {
							memory->free(memory, (URI_CHAR *)walker->text.first);
						}

						if (prev == NULL) {
							/* Last and first */
							if (URI_FUNC(IsHostSet)(uri)) {
								/* Replace "." with empty segment to represent trailing slash */
								walker->text.first = URI_FUNC(SafeToPointTo);
								walker->text.afterLast = URI_FUNC(SafeToPointTo);
							} else {
								memory->free(memory, walker);

								uri->pathHead = NULL;
								uri->pathTail = NULL;
							}
						} else {
							/* Last but not first, replace "." with empty segment to represent trailing slash */
							walker->text.first = URI_FUNC(SafeToPointTo);
							walker->text.afterLast = URI_FUNC(SafeToPointTo);
						}
					}

					walker = nextBackup;
				}
			}
			break;

		case 2:
			if (((walker->text.first)[0] == _UT('.'))
					&& ((walker->text.first)[1] == _UT('.'))) {
				/* Path ".." -> remove this and the previous segment */
				URI_TYPE(PathSegment) * const prev = walker->reserved;
				URI_TYPE(PathSegment) * prevPrev;
				URI_TYPE(PathSegment) * const nextBackup = walker->next;

				removeSegment = URI_TRUE;
				if (relative) {
					if (prev == NULL) {
						/* We cannot remove traversal beyond because the
						 * URI is relative and may be resolved later.
						 * So we can simplify "a/../b/d" to "b/d" but
						 * we cannot simplify "../b/d" (outside of reference resolution). */
						removeSegment = URI_FALSE;
					} else if ((prev != NULL)
							&& ((prev->text.afterLast - prev->text.first) == 2)
							&& ((prev->text.first)[0] == _UT('.'))
							&& ((prev->text.first)[1] == _UT('.'))) {
						/* We need to protect against mis-simplifying "a/../../b" to "a/b". */
						removeSegment = URI_FALSE;
					}
				}

				if (removeSegment) {
					if (prev != NULL) {
						/* Not first segment */
						prevPrev = prev->reserved;
						if (prevPrev != NULL) {
							/* Not even prev is the first one
							 * OLD: prevPrev -> prev -> walker -> (next|NULL)
							 * NEW: prevPrev -------------------> (next|NULL) */
							prevPrev->next = walker->next;
							if (walker->next != NULL) {
								/* Update parent relationship as well
								 * OLD: prevPrev <- prev <- walker <- next
								 * NEW: prevPrev <------------------- next */
								walker->next->reserved = prevPrev;
							} else {
								/* Last segment -> insert "" segment to represent trailing slash, update tail */
								URI_TYPE(PathSegment) * const segment = memory->calloc(memory, 1, sizeof(URI_TYPE(PathSegment)));
								if (segment == NULL) {
									if (pathOwned && (walker->text.first != walker->text.afterLast)) {
										memory->free(memory, (URI_CHAR *)walker->text.first);
									}
									memory->free(memory, walker);

									if (pathOwned && (prev->text.first != prev->text.afterLast)) {
										memory->free(memory, (URI_CHAR *)prev->text.first);
									}
									memory->free(memory, prev);

									return URI_FALSE; /* Raises malloc error */
								}
								segment->text.first = URI_FUNC(SafeToPointTo);
								segment->text.afterLast = URI_FUNC(SafeToPointTo);
								prevPrev->next = segment;
								uri->pathTail = segment;
							}

							if (pathOwned && (walker->text.first != walker->text.afterLast)) {
								memory->free(memory, (URI_CHAR *)walker->text.first);
							}
							memory->free(memory, walker);

							if (pathOwned && (prev->text.first != prev->text.afterLast)) {
								memory->free(memory, (URI_CHAR *)prev->text.first);
							}
							memory->free(memory, prev);

							walker = nextBackup;
						} else {
							/* Prev is the first segment */
							if (walker->next != NULL) {
								uri->pathHead = walker->next;
								walker->next->reserved = NULL;

								if (pathOwned && (walker->text.first != walker->text.afterLast)) {
									memory->free(memory, (URI_CHAR *)walker->text.first);
								}
								memory->free(memory, walker);
							} else {
								/* Re-use segment for "" path segment to represent trailing slash, update tail */
								URI_TYPE(PathSegment) * const segment = walker;
								if (pathOwned && (segment->text.first != segment->text.afterLast)) {
									memory->free(memory, (URI_CHAR *)segment->text.first);
								}
								segment->text.first = URI_FUNC(SafeToPointTo);
								segment->text.afterLast = URI_FUNC(SafeToPointTo);
								uri->pathHead = segment;
								uri->pathTail = segment;
							}

							if (pathOwned && (prev->text.first != prev->text.afterLast)) {
								memory->free(memory, (URI_CHAR *)prev->text.first);
							}
							memory->free(memory, prev);

							walker = nextBackup;
						}
					} else {
						URI_TYPE(PathSegment) * const anotherNextBackup = walker->next;
						int freeWalker = URI_TRUE;

						/* First segment */
						if (walker->next != NULL) {
							/* First segment of multiple -> update head
							 * OLD: head -> walker -> next
							 * NEW: head -----------> next */
							uri->pathHead = walker->next;

							/* Update parent link as well
							 * OLD: head <- walker <- next
							 * NEW: head <----------- next */
							walker->next->reserved = NULL;
						} else {
							if (uri->absolutePath) {
								/* First and only segment -> update head
								 * OLD: head -> walker -> NULL
								 * NEW: head -----------> NULL */
								uri->pathHead = NULL;

								/* Last segment -> update tail
								 * OLD: tail -> walker
								 * NEW: tail -> NULL */
								uri->pathTail = NULL;
							} else {
								/* Re-use segment for "" path segment to represent trailing slash,
								 * then update head and tail */
								if (pathOwned && (walker->text.first != walker->text.afterLast)) {
									memory->free(memory, (URI_CHAR *)walker->text.first);
								}
								walker->text.first = URI_FUNC(SafeToPointTo);
								walker->text.afterLast = URI_FUNC(SafeToPointTo);
								freeWalker = URI_FALSE;
							}
						}

						if (freeWalker) {
							if (pathOwned && (walker->text.first != walker->text.afterLast)) {
								memory->free(memory, (URI_CHAR *)walker->text.first);
							}
							memory->free(memory, walker);
						}

						walker = anotherNextBackup;
					}
				}
			}
			break;
		} /* end of switch */

		if (!removeSegment) {
			/* .. then let's move to the next element, and start again. */
			if (walker->next != NULL) {
				walker->next->reserved = walker;
			} else {
				/* Last segment -> update tail */
				uri->pathTail = walker;
			}
			walker = walker->next;
		}
	} while (walker != NULL);

	return URI_TRUE;
}